

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::GLMRegressor::ByteSizeLong(GLMRegressor *this)

{
  long lVar1;
  Rep *pRVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  void **ppvVar8;
  
  lVar7 = (long)(this->weights_).super_RepeatedPtrFieldBase.current_size_;
  pRVar2 = (this->weights_).super_RepeatedPtrFieldBase.rep_;
  ppvVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar8 = (void **)0x0;
  }
  lVar1 = lVar7 * 8;
  for (lVar6 = 0; lVar1 - lVar6 != 0; lVar6 = lVar6 + 8) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::GLMRegressor_DoubleArray>
                      (*(GLMRegressor_DoubleArray **)((long)ppvVar8 + lVar6));
    lVar7 = lVar7 + sVar3;
  }
  uVar4 = (ulong)(uint)(this->offset_).current_size_;
  if (uVar4 != 0) {
    uVar5 = ((long)(uVar4 << 0x23) >> 0x20) + 1;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    lVar7 = lVar7 + (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar3 = lVar7 + uVar4 * 8;
  if ((long)this->postevaluationtransform_ != 0) {
    uVar4 = (long)this->postevaluationtransform_ | 1;
    lVar7 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar7 * 9 + 0x49U >> 6) + 1;
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar4 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar3;
  return sVar3;
}

Assistant:

size_t GLMRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GLMRegressor)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.GLMRegressor.DoubleArray weights = 1;
  total_size += 1UL * this->_internal_weights_size();
  for (const auto& msg : this->weights_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated double offset = 2;
  {
    unsigned int count = static_cast<unsigned int>(this->_internal_offset_size());
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    total_size += data_size;
  }

  // .CoreML.Specification.GLMRegressor.PostEvaluationTransform postEvaluationTransform = 3;
  if (this->_internal_postevaluationtransform() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_postevaluationtransform());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}